

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::NullTypeHandlerBase::SetIsPrototype(NullTypeHandlerBase *this,DynamicObject *instance)

{
  code *pcVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  PropertyTypes values;
  DynamicTypeHandler *this_00;
  undefined4 *puVar6;
  NullTypeHandler<true> *protoTypeHandler;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  if (((this->super_DynamicTypeHandler).field_0x15 & 1) == 0) {
    this_00 = (DynamicTypeHandler *)NullTypeHandler<true>::GetDefaultInstance();
    bVar2 = DynamicTypeHandler::GetFlags(this_00);
    bVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
    if (bVar2 != (bVar3 | 0x20)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                  ,0x14d,
                                  "(protoTypeHandler->GetFlags() == (GetFlags() | IsPrototypeFlag))"
                                  ,"Why did we change the flags of a NullTypeHandler?");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar4 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
    bVar5 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(this_00);
    if (bVar4 != bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                  ,0x14e,
                                  "(this->GetIsInlineSlotCapacityLocked() == protoTypeHandler->GetIsInlineSlotCapacityLocked())"
                                  ,
                                  "this->GetIsInlineSlotCapacityLocked() == protoTypeHandler->GetIsInlineSlotCapacityLocked()"
                                 );
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
    DynamicTypeHandler::SetPropertyTypes(this_00,0xb0,values);
    DynamicTypeHandler::SetInstanceTypeHandler(instance,this_00,true);
  }
  return;
}

Assistant:

void NullTypeHandlerBase::SetIsPrototype(DynamicObject* instance)
    {
        if (!this->isPrototype)
        {
            // We don't force a type transition even when ChangeTypeOnProto() == true, because objects with NullTypeHandlers don't
            // have any properties, so there is nothing to invalidate.  Types with NullTypeHandlers also aren't cached in typeWithoutProperty
            // caches, so there will be no fast property add path that could skip prototype cache invalidation.
            NullTypeHandler<true>* protoTypeHandler = NullTypeHandler<true>::GetDefaultInstance();
            AssertMsg(protoTypeHandler->GetFlags() == (GetFlags() | IsPrototypeFlag), "Why did we change the flags of a NullTypeHandler?");
            Assert(this->GetIsInlineSlotCapacityLocked() == protoTypeHandler->GetIsInlineSlotCapacityLocked());
            protoTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            SetInstanceTypeHandler(instance, protoTypeHandler);
        }
    }